

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
libcellml::Generator::GeneratorImpl::addExternNlaSolveMethodCode(GeneratorImpl *this)

{
  bool bVar1;
  string sStack_78;
  string local_58;
  string local_38;
  
  bVar1 = modelHasNlas(this);
  if (bVar1) {
    GeneratorProfile::externNlaSolveMethodString_abi_cxx11_
              (&sStack_78,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::~string((string *)&sStack_78);
    if (sStack_78._M_string_length != 0) {
      newLineIfNeeded_abi_cxx11_(&local_38,this);
      GeneratorProfile::externNlaSolveMethodString_abi_cxx11_
                (&local_58,
                 (this->mProfile).
                 super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      std::operator+(&sStack_78,&local_38,&local_58);
      std::__cxx11::string::append((string *)&this->mCode);
      std::__cxx11::string::~string((string *)&sStack_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addExternNlaSolveMethodCode()
{
    if (modelHasNlas()
        && !mProfile->externNlaSolveMethodString().empty()) {
        mCode += newLineIfNeeded()
                 + mProfile->externNlaSolveMethodString();
    }
}